

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig.c
# Opt level: O1

int sigMain(int argc,char **argv)

{
  int iVar1;
  bool_t bVar2;
  err_t code;
  size_t sVar3;
  octet *privkey;
  char *pcVar4;
  int iVar5;
  err_t eVar6;
  int iVar7;
  char *pcVar8;
  char **ppcVar9;
  cmd_pwd_t pwd;
  octet date [6];
  cmd_pwd_t local_50;
  char *local_48;
  octet local_3e [6];
  size_t local_38;
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  sig sign [options] <privkey> <file>\n    sign <file> using <privkey> and attach signature\n  sig sign [options] <privkey> <file> <sig>\n    sign <file> using <privkey> and store signature in <sig>\n  sig val {-pubkey <pubkey>|-anchor <anchor>} <file>\n    verify signature attached to <file> using <pubkey> or <anchor>\n  sig val {-pubkey <pubkey>|-anchor <anchor>} <file> <sig>\n    verify <sig> of <file> using <pubkey> or <anchor>\n  sig extr {-cert<n>|-body|-sig} <sig> <obj_file>\n    extract object from <sig> and store it in <obj_file>\n      -cert<n> -- <n>th attached certificate\n        \\remark certificates are numbered from zero\n        \\remark signing certificate comes last\n      -body -- signed body\n      -sig -- signature itself\n  sig print [field] <sig>\n    print <sig> info: all fields or a specific field\n  .\n  <privkey>\n    container with private key\n  <pubkey>\n    file with public key\n  <anchor>\n    file with trusted certificate\n  options:\n    -certs <certs> -- certificate chain (optional)\n    -date <YYMMDD> -- date of signing (optional)\n    -pass <schema> -- password description\n  field:\n    {-certc|-date|-sig}\n      -certc -- number of attached certificates\n      -date -- date of signing\n      -sig -- base signature\n"
           ,"sig","sign files and verify signatures");
    return -1;
  }
  iVar1 = strCmp(argv[1],"sign");
  if (iVar1 == 0) {
    local_50 = (cmd_pwd_t)0x0;
    code = cmdStDo(8);
    if (code != 0) goto LAB_0010c9b6;
    ppcVar9 = argv + 2;
    memSet(local_3e,'\0',6);
    iVar1 = argc + -2;
    if (iVar1 == 0) {
      local_48 = (char *)0x0;
      iVar1 = 0;
    }
    else {
      iVar5 = argc + -3;
      local_48 = (char *)0x0;
      do {
        bVar2 = strStartsWith(*ppcVar9,"-");
        if (bVar2 == 0) goto LAB_0010c91d;
        iVar7 = iVar5 + 1;
        eVar6 = 0x25b;
        if (iVar7 < 2) {
          iVar7 = 1;
          goto LAB_0010c920;
        }
        bVar2 = strStartsWith(*ppcVar9,"-certs");
        if (bVar2 == 0) {
          bVar2 = strStartsWith(*ppcVar9,"-date");
          if (bVar2 == 0) {
            bVar2 = strStartsWith(*ppcVar9,"-pass");
            if (bVar2 == 0) goto LAB_0010c920;
            if (local_50 == (cmd_pwd_t)0x0) {
              eVar6 = cmdPwdRead(&local_50,ppcVar9[1]);
              goto LAB_0010c747;
            }
          }
          else {
            bVar2 = memIsZero(local_3e,6);
            if (bVar2 != 0) {
              eVar6 = cmdDateParse(local_3e,ppcVar9[1]);
LAB_0010c747:
              if (eVar6 == 0) goto LAB_0010c74f;
              ppcVar9 = ppcVar9 + 1;
              iVar7 = iVar5;
              goto LAB_0010c920;
            }
          }
LAB_0010ca0f:
          eVar6 = 0x25c;
          iVar7 = iVar1;
          goto LAB_0010c920;
        }
        if (local_48 != (char *)0x0) goto LAB_0010ca0f;
        local_48 = ppcVar9[1];
LAB_0010c74f:
        ppcVar9 = ppcVar9 + 2;
        iVar1 = iVar1 + -2;
        iVar5 = iVar5 + -2;
      } while (iVar5 != -1);
      iVar1 = 0;
    }
LAB_0010c91d:
    eVar6 = 0;
    iVar7 = iVar1;
LAB_0010c920:
    if (((eVar6 != 0) || ((code = 0x25b, local_50 != (cmd_pwd_t)0x0 && (0xfffffffd < iVar7 - 4U))))
       && (code = eVar6, iVar7 == 3)) {
      bVar2 = cmdFileAreSame(ppcVar9[1],ppcVar9[2]);
      code = 0xd3;
      if (bVar2 == 0) {
        code = eVar6;
      }
    }
    if (((code == 0) && (code = cmdFileValExist(2,ppcVar9), code == 0)) &&
       ((iVar7 != 3 || (code = cmdFileValNotExist(1,ppcVar9 + 2), code == 0)))) {
      local_38 = 0;
      code = cmdPrivkeyRead((octet *)0x0,&local_38,*ppcVar9,local_50);
      if (code == 0) {
        privkey = (octet *)blobCreate(local_38);
        if (privkey != (octet *)0x0) {
          code = cmdPrivkeyRead(privkey,(size_t *)0x0,*ppcVar9,local_50);
          cmdPwdClose(local_50);
          if (code == 0) {
            code = cmdSigSign(ppcVar9[(ulong)(iVar7 == 3) + 1],ppcVar9[1],local_48,local_3e,privkey,
                              local_38);
          }
          goto LAB_0010cac5;
        }
        cmdPwdClose(local_50);
        goto LAB_0010ca9f;
      }
    }
    cmdPwdClose(local_50);
  }
  else {
    iVar1 = strCmp(argv[1],"val");
    if (iVar1 != 0) {
      iVar1 = strCmp(argv[1],"extr");
      if (iVar1 == 0) {
        code = 0x25b;
        if (argc == 5) {
          pcVar8 = argv[2];
          sVar3 = strLen(pcVar8);
          if ((sVar3 != 0) && (*pcVar8 == '-')) {
            code = cmdFileValExist(1,argv + 3);
            if (code == 0) {
              code = cmdFileValNotExist(1,argv + 4);
              if (code == 0) {
                code = cmdSigExtr(argv[4],argv[3],pcVar8 + 1);
              }
            }
          }
        }
      }
      else {
        iVar1 = strCmp(argv[1],"print");
        code = 0x259;
        if ((iVar1 == 0) && (code = 0x25b, 0xfffffffd < argc - 5U)) {
          ppcVar9 = argv + 2;
          if (argc == 4) {
            pcVar8 = *ppcVar9;
            sVar3 = strLen(pcVar8);
            if ((sVar3 == 0) || (*pcVar8 != '-')) goto LAB_0010c9b6;
            pcVar8 = pcVar8 + 1;
            ppcVar9 = argv + 3;
          }
          else {
            pcVar8 = (char *)0x0;
          }
          code = cmdFileValExist(1,ppcVar9);
          if (code == 0) {
            code = cmdSigPrint(*ppcVar9,pcVar8);
          }
        }
      }
      goto LAB_0010c9b6;
    }
    code = cmdStDo(8);
    if (((code != 0) || (code = 0x25b, argc - 7U < 0xfffffffe)) ||
       ((iVar1 = strCmp(argv[2],"-pubkey"), iVar1 != 0 &&
        (iVar1 = strCmp(argv[2],"-anchor"), iVar1 != 0)))) goto LAB_0010c9b6;
    if (argc == 6) {
      bVar2 = cmdFileAreSame(argv[4],argv[5]);
      code = 0xd3;
      if (bVar2 != 0) goto LAB_0010c9b6;
    }
    ppcVar9 = argv + 3;
    code = cmdFileValExist(argc + -3,ppcVar9);
    if ((code != 0) || (code = cmdFileReadAll((void *)0x0,(size_t *)&local_50,*ppcVar9), code != 0))
    goto LAB_0010c9b6;
    privkey = (octet *)blobCreate((size_t)local_50);
    if (privkey != (octet *)0x0) {
      code = cmdFileReadAll(privkey,(size_t *)&local_50,*ppcVar9);
      if (code == 0) {
        iVar1 = strCmp(argv[2],"-pubkey");
        pcVar8 = argv[4];
        if (iVar1 == 0) {
          pcVar4 = pcVar8;
          if (argc == 6) {
            pcVar4 = argv[5];
          }
          code = cmdSigVerify(pcVar8,pcVar4,privkey,(size_t)local_50);
        }
        else {
          pcVar4 = pcVar8;
          if (argc == 6) {
            pcVar4 = argv[5];
          }
          code = cmdSigVerify2(pcVar8,pcVar4,privkey,(size_t)local_50);
        }
      }
LAB_0010cac5:
      blobClose(privkey);
      goto LAB_0010c9b6;
    }
LAB_0010ca9f:
    code = 0x6e;
  }
LAB_0010c9b6:
  if ((code != 0) || (iVar1 = strCmp(argv[1],"val"), iVar1 == 0)) {
    pcVar8 = errMsg(code);
    printf("bee2cmd/%s: %s\n","sig",pcVar8);
  }
  return -(uint)(code != 0);
}

Assistant:

static int sigMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return sigUsage();
	// разбор команды
	--argc, ++argv;
	if (strEq(argv[0], "sign"))
		code = sigSign(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))	
		code = sigVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = sigExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = sigPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}